

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::checkForNamedInterface(CoreBroker *this,ActionMessage *command)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view string2;
  string_view string2_00;
  string_view string2_01;
  string_view string2_02;
  GlobalHandle fed_id;
  GlobalHandle fed_id_00;
  GlobalHandle fed_id_01;
  GlobalHandle fed_id_02;
  string_view string1;
  string_view string1_00;
  string_view string1_01;
  string_view string1_02;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view str;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view type;
  string_view type_00;
  string_view units;
  string_view units_00;
  string_view message;
  bool bVar1;
  action_t aVar2;
  pointer pBVar3;
  BasicHandleInfo *pBVar4;
  ulong uVar5;
  HandleManager *in_RSI;
  CoreBroker *in_RDI;
  __sv_type _Var6;
  BasicHandleInfo *afilt;
  BasicHandleInfo *filt_2;
  BasicHandleInfo *apub;
  BasicHandleInfo *pub_2;
  BasicHandleInfo *filt_1;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fed_2;
  BasicHandleInfo *ept;
  BasicHandleInfo *filt;
  BasicHandleInfo *pub_1;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fed_1;
  BasicHandleInfo *inp;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fed;
  BasicHandleInfo *pub;
  bool foundInterface;
  undefined6 in_stack_fffffffffffffb88;
  InterfaceFlags in_stack_fffffffffffffb8e;
  undefined4 in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  ActionMessage *in_stack_fffffffffffffb98;
  HandleManager *in_stack_fffffffffffffba0;
  ActionMessage *message_00;
  GlobalFederateId in_stack_fffffffffffffba8;
  InterfaceHandle in_stack_fffffffffffffbac;
  undefined6 in_stack_fffffffffffffbb0;
  uint16_t in_stack_fffffffffffffbb6;
  uint16_t flags;
  UnknownHandleManager *in_stack_fffffffffffffbb8;
  GlobalHandle in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  UnknownHandleManager *pUVar7;
  char *in_stack_fffffffffffffbd0;
  InterfaceType IVar8;
  HandleManager *in_stack_fffffffffffffbf8;
  HandleManager *in_stack_fffffffffffffc00;
  HandleManager *in_stack_fffffffffffffc08;
  HandleManager *in_stack_fffffffffffffc10;
  HandleManager *in_stack_fffffffffffffc20;
  HandleManager *in_stack_fffffffffffffc28;
  HandleManager *in_stack_fffffffffffffc30;
  HandleManager *in_stack_fffffffffffffc38;
  GlobalFederateId local_324;
  GlobalHandle local_320;
  undefined1 in_stack_fffffffffffffce8 [16];
  undefined1 auVar9 [13];
  string_view in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffd08 [16];
  ActionMessage *local_298;
  basic_string_view<char,_std::char_traits<char>_> local_280;
  undefined4 local_270;
  undefined4 local_26c;
  BasicHandleInfo *local_268;
  GlobalHandle local_260;
  BasicHandleInfo *local_258;
  GlobalHandle local_250;
  string_view local_248;
  GlobalHandle local_238;
  string_view local_230;
  GlobalHandle local_220;
  __sv_type local_218;
  __sv_type local_208;
  GlobalHandle local_1f8;
  __sv_type local_1f0;
  __sv_type local_1e0;
  GlobalHandle in_stack_fffffffffffffe30;
  pair<helics::route_id,_helics::ActionMessage> *in_stack_fffffffffffffe38;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_1b8;
  string_view local_1b0;
  BasicHandleInfo *local_1a0;
  __sv_type local_198;
  __sv_type local_188;
  GlobalHandle local_178;
  string_view local_170;
  pair<helics::route_id,_helics::ActionMessage> *local_160;
  GlobalHandle local_158;
  __sv_type local_150;
  __sv_type local_140;
  __sv_type local_130;
  GlobalHandle local_120;
  BasicHandleInfo *local_118;
  GlobalHandle local_10c;
  BaseType local_104;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_100;
  string_view local_f8;
  BasicHandleInfo *local_e8;
  GlobalHandle local_e0;
  __sv_type local_d8;
  __sv_type local_c8;
  __sv_type local_b8;
  GlobalHandle local_a4;
  BaseType local_9c;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_98;
  string_view local_90;
  BasicHandleInfo *local_80;
  GlobalHandle local_78;
  string_view local_70;
  GlobalHandle local_60;
  string_view local_58;
  GlobalHandle local_48;
  string_view local_40;
  GlobalHandle local_30;
  string_view local_28;
  byte local_11;
  HandleManager *local_10;
  
  auVar9 = in_stack_fffffffffffffce8._3_13_;
  local_11 = 0;
  local_10 = in_RSI;
  bVar1 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                    ((ActionMessage *)in_RSI,reconnectable_flag);
  if ((bVar1) && (((in_RDI->super_BrokerBase).field_0x294 & 1) != 0)) {
    aVar2 = ActionMessage::action((ActionMessage *)local_10);
    switch(aVar2) {
    case cmd_add_named_input:
      local_40 = ActionMessage::name((ActionMessage *)0x51cf6f);
      local_48 = ActionMessage::getSource
                           ((ActionMessage *)
                            CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
      key_00._M_str = in_stack_fffffffffffffbd0;
      key_00._M_len = in_stack_fffffffffffffbc8;
      UnknownHandleManager::addReconnectableInput
                (in_stack_fffffffffffffbb8,key_00,in_stack_fffffffffffffbc0,
                 in_stack_fffffffffffffbb6);
      break;
    case cmd_add_named_filter:
      local_70 = ActionMessage::name((ActionMessage *)0x51d073);
      local_78 = ActionMessage::getSource
                           ((ActionMessage *)
                            CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
      key_02._M_str = in_stack_fffffffffffffbd0;
      key_02._M_len = in_stack_fffffffffffffbc8;
      UnknownHandleManager::addReconnectableFilter
                (in_stack_fffffffffffffbb8,key_02,in_stack_fffffffffffffbc0,
                 in_stack_fffffffffffffbb6);
      break;
    case cmd_add_named_publication:
      local_28 = ActionMessage::name((ActionMessage *)0x51ceed);
      local_30 = ActionMessage::getSource
                           ((ActionMessage *)
                            CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
      key._M_str = in_stack_fffffffffffffbd0;
      key._M_len = in_stack_fffffffffffffbc8;
      UnknownHandleManager::addReconnectablePublication
                (in_stack_fffffffffffffbb8,key,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb6);
      break;
    case cmd_add_named_endpoint:
      local_58 = ActionMessage::name((ActionMessage *)0x51cff1);
      local_60 = ActionMessage::getSource
                           ((ActionMessage *)
                            CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
      key_01._M_str = in_stack_fffffffffffffbd0;
      key_01._M_len = in_stack_fffffffffffffbc8;
      UnknownHandleManager::addReconnectableEndpoint
                (in_stack_fffffffffffffbb8,key_01,in_stack_fffffffffffffbc0,
                 in_stack_fffffffffffffbb6);
    }
  }
  aVar2 = ActionMessage::action((ActionMessage *)local_10);
  switch(aVar2) {
  case cmd_add_named_input:
    local_f8 = ActionMessage::name((ActionMessage *)0x51d3e8);
    name_03._M_str = (char *)in_stack_fffffffffffffbc0;
    name_03._M_len = (size_t)in_stack_fffffffffffffbb8;
    local_e8 = HandleManager::getInterfaceHandle
                         ((HandleManager *)
                          CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),name_03,
                          (InterfaceType)((uint)in_stack_fffffffffffffbac.hid >> 0x18));
    if (local_e8 != (BasicHandleInfo *)0x0) {
      local_104 = (BaseType)BasicHandleInfo::getFederateId(local_e8);
      local_100 = gmlc::containers::
                  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                  ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                          *)CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid),
                         (GlobalFederateId *)in_stack_fffffffffffffba0);
      pBVar3 = __gnu_cxx::
               __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
               ::operator->(&local_100);
      if (pBVar3->state < ERROR_STATE) {
        ActionMessage::setAction((ActionMessage *)local_10,cmd_add_publisher);
        local_10c = local_e8->handle;
        ActionMessage::setDestination((ActionMessage *)local_10,local_10c);
        local_120 = ActionMessage::getSource
                              ((ActionMessage *)
                               CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
        fed_id.handle.hid = in_stack_fffffffffffffbac.hid;
        fed_id.fed_id.gid = in_stack_fffffffffffffba8.gid;
        local_118 = HandleManager::findHandle(in_stack_fffffffffffffba0,fed_id);
        if (local_118 != (BasicHandleInfo *)0x0) {
          local_130 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          local_140 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          string1_00._M_len._4_4_ = in_stack_fffffffffffffbac.hid;
          string1_00._M_len._0_4_ = in_stack_fffffffffffffba8.gid;
          string1_00._M_str._0_6_ = in_stack_fffffffffffffbb0;
          string1_00._M_str._6_2_ = in_stack_fffffffffffffbb6;
          string2_00._M_str = (char *)in_stack_fffffffffffffba0;
          string2_00._M_len = (size_t)in_stack_fffffffffffffb98;
          ActionMessage::setStringData
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                     string1_00,string2_00);
        }
        SmallBuffer::clear((SmallBuffer *)
                           &(local_10->handles).
                            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_last);
        routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
        ActionMessage::setAction((ActionMessage *)local_10,cmd_add_subscriber);
        ActionMessage::swapSourceDest
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        ActionMessage::clearStringData((ActionMessage *)0x51d5ed);
        in_stack_fffffffffffffc38 = local_10;
        local_150 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        name_00._M_len._6_2_ = in_stack_fffffffffffffb8e;
        name_00._M_len._0_6_ = in_stack_fffffffffffffb88;
        name_00._M_str._0_4_ = in_stack_fffffffffffffb90;
        name_00._M_str._4_4_ = in_stack_fffffffffffffb94;
        ActionMessage::name((ActionMessage *)0x51d63b,name_00);
        routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
      }
      else {
        ActionMessage::setAction((ActionMessage *)local_10,cmd_add_subscriber);
        setActionFlag<helics::ActionMessage,helics::GeneralFlags>
                  ((ActionMessage *)local_10,error_flag);
        ActionMessage::swapSourceDest
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        local_158 = local_e8->handle;
        ActionMessage::setSource((ActionMessage *)local_10,local_158);
        ActionMessage::clearStringData((ActionMessage *)0x51d6b8);
        routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
      }
      local_11 = 1;
    }
    break;
  case cmd_add_named_filter:
    in_stack_fffffffffffffc30 = &in_RDI->handles;
    local_170 = ActionMessage::name((ActionMessage *)0x51d6fd);
    name_04._M_str = (char *)in_stack_fffffffffffffbc0;
    name_04._M_len = (size_t)in_stack_fffffffffffffbb8;
    local_160 = (pair<helics::route_id,_helics::ActionMessage> *)
                HandleManager::getInterfaceHandle
                          ((HandleManager *)
                           CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),name_04,
                           (InterfaceType)((uint)in_stack_fffffffffffffbac.hid >> 0x18));
    if (local_160 != (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
      ActionMessage::setAction((ActionMessage *)local_10,cmd_add_endpoint);
      local_178.fed_id.gid = (local_160->first).rid;
      local_178.handle.hid = *(BaseType *)&local_160->field_0x4;
      ActionMessage::setDestination((ActionMessage *)local_10,local_178);
      SmallBuffer::clear((SmallBuffer *)
                         &(local_10->handles).
                          super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last);
      routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                   (ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
      ActionMessage::setAction((ActionMessage *)local_10,cmd_add_filter);
      ActionMessage::swapSourceDest
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x51d7d6);
      if ((!bVar1) ||
         (bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x51d7ed), !bVar1)) {
        in_stack_fffffffffffffc28 = local_10;
        local_188 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        local_198 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        string1_01._M_len._4_4_ = in_stack_fffffffffffffbac.hid;
        string1_01._M_len._0_4_ = in_stack_fffffffffffffba8.gid;
        string1_01._M_str._0_6_ = in_stack_fffffffffffffbb0;
        string1_01._M_str._6_2_ = in_stack_fffffffffffffbb6;
        string2_01._M_str = (char *)in_stack_fffffffffffffba0;
        string2_01._M_len = (size_t)in_stack_fffffffffffffb98;
        ActionMessage::setStringData
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                   string1_01,string2_01);
      }
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>(local_160,clone_flag);
      if (bVar1) {
        setActionFlag<helics::ActionMessage,helics::FilterFlags>
                  ((ActionMessage *)local_10,clone_flag);
      }
      routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                   (ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
      local_11 = 1;
    }
    break;
  case cmd_add_named_publication:
    local_90 = ActionMessage::name((ActionMessage *)0x51d133);
    name_02._M_str = (char *)in_stack_fffffffffffffbc0;
    name_02._M_len = (size_t)in_stack_fffffffffffffbb8;
    local_80 = HandleManager::getInterfaceHandle
                         ((HandleManager *)
                          CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),name_02,
                          (InterfaceType)((uint)in_stack_fffffffffffffbac.hid >> 0x18));
    if (local_80 != (BasicHandleInfo *)0x0) {
      local_9c = (BaseType)BasicHandleInfo::getFederateId(local_80);
      local_98 = gmlc::containers::
                 DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                 ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                         *)CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid),
                        (GlobalFederateId *)in_stack_fffffffffffffba0);
      pBVar3 = __gnu_cxx::
               __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
               ::operator->(&local_98);
      if (pBVar3->state < ERROR_STATE) {
        ActionMessage::setAction((ActionMessage *)local_10,cmd_add_subscriber);
        local_a4 = local_80->handle;
        ActionMessage::setDestination((ActionMessage *)local_10,local_a4);
        SmallBuffer::clear((SmallBuffer *)
                           &(local_10->handles).
                            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_last);
        routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
        ActionMessage::setAction((ActionMessage *)local_10,cmd_add_publisher);
        ActionMessage::swapSourceDest
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        name._M_len._6_2_ = in_stack_fffffffffffffb8e;
        name._M_len._0_6_ = in_stack_fffffffffffffb88;
        name._M_str._0_4_ = in_stack_fffffffffffffb90;
        name._M_str._4_4_ = in_stack_fffffffffffffb94;
        ActionMessage::name((ActionMessage *)0x51d2a7,name);
        local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        local_d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        string1._M_len._4_4_ = in_stack_fffffffffffffbac.hid;
        string1._M_len._0_4_ = in_stack_fffffffffffffba8.gid;
        string1._M_str._0_6_ = in_stack_fffffffffffffbb0;
        string1._M_str._6_2_ = in_stack_fffffffffffffbb6;
        string2._M_str = (char *)in_stack_fffffffffffffba0;
        string2._M_len = (size_t)in_stack_fffffffffffffb98;
        ActionMessage::setStringData
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                   string1,string2);
        routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
      }
      else {
        ActionMessage::setAction((ActionMessage *)local_10,cmd_add_publisher);
        setActionFlag<helics::ActionMessage,helics::GeneralFlags>
                  ((ActionMessage *)local_10,error_flag);
        ActionMessage::swapSourceDest
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        local_e0 = local_80->handle;
        ActionMessage::setSource((ActionMessage *)local_10,local_e0);
        ActionMessage::clearStringData((ActionMessage *)0x51d3a3);
        routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
      }
      local_11 = 1;
    }
    break;
  case cmd_add_named_endpoint:
    in_stack_fffffffffffffc20 = &in_RDI->handles;
    local_1b0 = ActionMessage::name((ActionMessage *)0x51d8df);
    name_05._M_str = (char *)in_stack_fffffffffffffbc0;
    name_05._M_len = (size_t)in_stack_fffffffffffffbb8;
    local_1a0 = HandleManager::getInterfaceHandle
                          ((HandleManager *)
                           CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),name_05,
                           (InterfaceType)((uint)in_stack_fffffffffffffbac.hid >> 0x18));
    if (local_1a0 != (BasicHandleInfo *)0x0) {
      BasicHandleInfo::getFederateId(local_1a0);
      local_1b8 = gmlc::containers::
                  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                  ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                          *)CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid),
                         (GlobalFederateId *)in_stack_fffffffffffffba0);
      pBVar3 = __gnu_cxx::
               __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
               ::operator->(&local_1b8);
      if (pBVar3->state < ERROR_STATE) {
        if (*(short *)&(local_10->handles).
                       super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first == 0x65) {
          ActionMessage::setAction((ActionMessage *)local_10,cmd_add_endpoint);
          toggleActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                     in_stack_fffffffffffffb8e);
        }
        else {
          ActionMessage::setAction((ActionMessage *)local_10,cmd_add_filter);
          in_stack_fffffffffffffc10 = &in_RDI->handles;
          in_stack_fffffffffffffe30 =
               ActionMessage::getSource
                         ((ActionMessage *)
                          CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
          fed_id_00.handle.hid = in_stack_fffffffffffffbac.hid;
          fed_id_00.fed_id.gid = in_stack_fffffffffffffba8.gid;
          in_stack_fffffffffffffe38 =
               (pair<helics::route_id,_helics::ActionMessage> *)
               HandleManager::findHandle(in_stack_fffffffffffffba0,fed_id_00);
          if (in_stack_fffffffffffffe38 != (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
            bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x51da3a);
            if ((!bVar1) ||
               (bVar1 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x51da51), !bVar1)) {
              in_stack_fffffffffffffc08 = local_10;
              local_1e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90
                                                ));
              local_1f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90
                                                ));
              string1_02._M_len._4_4_ = in_stack_fffffffffffffbac.hid;
              string1_02._M_len._0_4_ = in_stack_fffffffffffffba8.gid;
              string1_02._M_str._0_6_ = in_stack_fffffffffffffbb0;
              string1_02._M_str._6_2_ = in_stack_fffffffffffffbb6;
              string2_02._M_str = (char *)in_stack_fffffffffffffba0;
              string2_02._M_len = (size_t)in_stack_fffffffffffffb98;
              ActionMessage::setStringData
                        ((ActionMessage *)
                         CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),string1_02,
                         string2_02);
            }
            bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>
                              (in_stack_fffffffffffffe38,clone_flag);
            if (bVar1) {
              setActionFlag<helics::ActionMessage,helics::FilterFlags>
                        ((ActionMessage *)local_10,clone_flag);
            }
          }
        }
        local_1f8 = local_1a0->handle;
        ActionMessage::setDestination((ActionMessage *)local_10,local_1f8);
        routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
        ActionMessage::setAction((ActionMessage *)local_10,cmd_add_endpoint);
        if (*(short *)&(local_10->handles).
                       super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first == 0x65) {
          toggleActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                     in_stack_fffffffffffffb8e);
          in_stack_fffffffffffffbf8 = local_10;
          local_208 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          name_01._M_len._6_2_ = in_stack_fffffffffffffb8e;
          name_01._M_len._0_6_ = in_stack_fffffffffffffb88;
          name_01._M_str._0_4_ = in_stack_fffffffffffffb90;
          name_01._M_str._4_4_ = in_stack_fffffffffffffb94;
          ActionMessage::name((ActionMessage *)0x51dbc0,name_01);
          in_stack_fffffffffffffc00 = local_10;
          local_218 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          str._M_str = (char *)in_stack_fffffffffffffbc0;
          str._M_len = (size_t)in_stack_fffffffffffffbb8;
          ActionMessage::setString
                    ((ActionMessage *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                     in_stack_fffffffffffffbac.hid,str);
        }
        ActionMessage::swapSourceDest
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
      }
      else {
        ActionMessage::setAction((ActionMessage *)local_10,cmd_add_endpoint);
        setActionFlag<helics::ActionMessage,helics::GeneralFlags>
                  ((ActionMessage *)local_10,error_flag);
        ActionMessage::swapSourceDest
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        local_220 = local_1a0->handle;
        ActionMessage::setSource((ActionMessage *)local_10,local_220);
        ActionMessage::clearStringData((ActionMessage *)0x51dc94);
        routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
      }
      local_11 = 1;
    }
  }
  if ((local_11 & 1) == 0) {
    if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
      routeMessage((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0),
                   (ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid));
    }
    else {
      aVar2 = ActionMessage::action((ActionMessage *)local_10);
      uVar5 = (ulong)(uint)(aVar2 + 0xffffff98);
      switch(uVar5) {
      case 0:
        local_248 = ActionMessage::name((ActionMessage *)0x51dda9);
        IVar8 = (InterfaceType)(uVar5 >> 0x38);
        local_250 = ActionMessage::getSource
                              ((ActionMessage *)
                               CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
        key_04._M_str = in_stack_fffffffffffffbd0;
        key_04._M_len = in_stack_fffffffffffffbc8;
        UnknownHandleManager::addUnknownInput
                  (in_stack_fffffffffffffbb8,key_04,in_stack_fffffffffffffbc0,
                   in_stack_fffffffffffffbb6);
        ActionMessage::getStringData_abi_cxx11_((ActionMessage *)local_10);
        bVar1 = CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffba0);
        if (!bVar1) {
          local_260 = ActionMessage::getSource
                                ((ActionMessage *)
                                 CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
          fed_id_01.handle.hid = in_stack_fffffffffffffbac.hid;
          fed_id_01.fed_id.gid = in_stack_fffffffffffffba8.gid;
          local_258 = HandleManager::findHandle(in_stack_fffffffffffffba0,fed_id_01);
          if (local_258 == (BasicHandleInfo *)0x0) {
            local_26c = (undefined4)
                        (local_10->handles).
                        super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                        ._M_impl.super__Deque_impl_data._M_map_size;
            local_270 = *(undefined4 *)
                         ((long)&(local_10->handles).
                                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                 ._M_impl.super__Deque_impl_data._M_map_size + 4);
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_280);
            ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffb98,in_stack_fffffffffffffb94)
            ;
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
            ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffb98,in_stack_fffffffffffffb94)
            ;
            _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
            local_298 = (ActionMessage *)_Var6._M_str;
            key_07._M_str = (char *)in_stack_fffffffffffffc08;
            key_07._M_len = (size_t)in_stack_fffffffffffffc00;
            type._M_str = (char *)in_stack_fffffffffffffc28;
            type._M_len = (size_t)in_stack_fffffffffffffc20;
            units._M_str = (char *)in_stack_fffffffffffffc38;
            units._M_len = (size_t)in_stack_fffffffffffffc30;
            local_268 = HandleManager::addHandle
                                  (in_stack_fffffffffffffbf8,
                                   (GlobalFederateId)
                                   (BaseType)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                                   (InterfaceHandle)(BaseType)in_stack_fffffffffffffc10,IVar8,key_07
                                   ,type,units);
            addLocalInfo((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)
                         ,(BasicHandleInfo *)
                          CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid),
                         local_298);
          }
        }
        break;
      case 1:
        flags = (uint16_t)((ulong)&in_RDI->unknownHandles >> 0x30);
        ActionMessage::name((ActionMessage *)0x51e1b8);
        local_320 = ActionMessage::getSource
                              ((ActionMessage *)
                               CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
        key_06._M_str = in_stack_fffffffffffffbd0;
        key_06._M_len = in_stack_fffffffffffffbc8;
        UnknownHandleManager::addUnknownFilter
                  (in_stack_fffffffffffffbb8,key_06,in_stack_fffffffffffffbc0,flags);
        break;
      case 2:
        local_230 = ActionMessage::name((ActionMessage *)0x51dd2d);
        local_238 = ActionMessage::getSource
                              ((ActionMessage *)
                               CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
        key_03._M_str = in_stack_fffffffffffffbd0;
        key_03._M_len = in_stack_fffffffffffffbc8;
        UnknownHandleManager::addUnknownPublication
                  (in_stack_fffffffffffffbb8,key_03,in_stack_fffffffffffffbc0,
                   in_stack_fffffffffffffbb6);
        break;
      case 3:
        pUVar7 = &in_RDI->unknownHandles;
        ActionMessage::name((ActionMessage *)0x51dfad);
        IVar8 = (InterfaceType)(uVar5 >> 0x38);
        ActionMessage::getSource
                  ((ActionMessage *)CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88));
        key_05._M_str = in_stack_fffffffffffffbd0;
        key_05._M_len = (size_t)pUVar7;
        UnknownHandleManager::addUnknownEndpoint
                  (in_stack_fffffffffffffbb8,key_05,in_stack_fffffffffffffbc0,
                   in_stack_fffffffffffffbb6);
        ActionMessage::getStringData_abi_cxx11_((ActionMessage *)local_10);
        bVar1 = CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffba0);
        if (!bVar1) {
          ActionMessage::getSource
                    ((ActionMessage *)CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88))
          ;
          fed_id_02.handle.hid = in_stack_fffffffffffffbac.hid;
          fed_id_02.fed_id.gid = in_stack_fffffffffffffba8.gid;
          pBVar4 = HandleManager::findHandle(in_stack_fffffffffffffba0,fed_id_02);
          if (pBVar4 == (BasicHandleInfo *)0x0) {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba0
                       ,(char *)in_stack_fffffffffffffb98);
            ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffb98,in_stack_fffffffffffffb94)
            ;
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
            ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffb98,in_stack_fffffffffffffb94)
            ;
            _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
            message_00 = (ActionMessage *)_Var6._M_str;
            key_08._M_str = (char *)in_stack_fffffffffffffc08;
            key_08._M_len = (size_t)in_stack_fffffffffffffc00;
            type_00._M_str = (char *)in_stack_fffffffffffffc28;
            type_00._M_len = (size_t)in_stack_fffffffffffffc20;
            units_00._M_str = (char *)in_stack_fffffffffffffc38;
            units_00._M_len = (size_t)in_stack_fffffffffffffc30;
            HandleManager::addHandle
                      (in_stack_fffffffffffffbf8,
                       (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                       (InterfaceHandle)(BaseType)in_stack_fffffffffffffc10,IVar8,key_08,type_00,
                       units_00);
            addLocalInfo((CoreBroker *)CONCAT26(in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0)
                         ,(BasicHandleInfo *)
                          CONCAT44(in_stack_fffffffffffffbac.hid,in_stack_fffffffffffffba8.gid),
                         message_00);
          }
        }
        break;
      default:
        GlobalFederateId::GlobalFederateId
                  (&local_324,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid)
        ;
        getIdentifier_abi_cxx11_(in_RDI);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba0,
                   (char *)in_stack_fffffffffffffb98);
        message._M_str = (char *)in_stack_fffffffffffffe38;
        message._M_len._0_4_ = in_stack_fffffffffffffe30.fed_id.gid;
        message._M_len._4_4_ = in_stack_fffffffffffffe30.handle.hid;
        BrokerBase::sendToLogger
                  (auVar9._5_8_,(GlobalFederateId)in_stack_fffffffffffffd08._4_4_,auVar9._1_4_,
                   in_stack_fffffffffffffcf8,message,auVar9[0]);
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::checkForNamedInterface(ActionMessage& command)
{
    bool foundInterface = false;
    if (checkActionFlag(command, reconnectable_flag)) {
        if (isRootc) {
            switch (command.action()) {
                case CMD_ADD_NAMED_PUBLICATION:
                    unknownHandles.addReconnectablePublication(command.name(),
                                                               command.getSource(),
                                                               command.flags);
                    break;
                case CMD_ADD_NAMED_INPUT:
                    unknownHandles.addReconnectableInput(command.name(),
                                                         command.getSource(),
                                                         command.flags);

                    break;
                case CMD_ADD_NAMED_ENDPOINT:
                    unknownHandles.addReconnectableEndpoint(command.name(),
                                                            command.getSource(),
                                                            command.flags);

                    break;
                case CMD_ADD_NAMED_FILTER:
                    unknownHandles.addReconnectableFilter(command.name(),
                                                          command.getSource(),
                                                          command.flags);
                    break;
                default:
                    break;
            }
        }
    }
    switch (command.action()) {
        case CMD_ADD_NAMED_PUBLICATION: {
            auto* pub = handles.getInterfaceHandle(command.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                auto fed = mFederates.find(pub->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    command.setDestination(pub->handle);
                    command.payload.clear();
                    routeMessage(command);
                    command.setAction(CMD_ADD_PUBLISHER);
                    command.swapSourceDest();
                    command.name(pub->key);
                    command.setStringData(pub->type, pub->units);
                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_PUBLISHER);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(pub->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_INPUT: {
            auto* inp = handles.getInterfaceHandle(command.name(), InterfaceType::INPUT);
            if (inp != nullptr) {
                auto fed = mFederates.find(inp->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    command.setAction(CMD_ADD_PUBLISHER);
                    command.setDestination(inp->handle);
                    auto* pub = handles.findHandle(command.getSource());
                    if (pub != nullptr) {
                        command.setStringData(pub->type, pub->units);
                    }
                    command.payload.clear();
                    routeMessage(command);
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    command.swapSourceDest();
                    command.clearStringData();
                    command.name(inp->key);
                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(inp->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_FILTER: {
            auto* filt = handles.getInterfaceHandle(command.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                command.setAction(CMD_ADD_ENDPOINT);
                command.setDestination(filt->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_ADD_FILTER);
                command.swapSourceDest();
                if ((!filt->type_in.empty()) || (!filt->type_out.empty())) {
                    command.setStringData(filt->type_in, filt->type_out);
                }
                if (checkActionFlag(*filt, clone_flag)) {
                    setActionFlag(command, clone_flag);
                }
                routeMessage(command);
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_ENDPOINT: {
            auto* ept = handles.getInterfaceHandle(command.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                auto fed = mFederates.find(ept->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    if (command.counter == static_cast<uint16_t>(InterfaceType::ENDPOINT)) {
                        command.setAction(CMD_ADD_ENDPOINT);
                        toggleActionFlag(command, destination_target);
                    } else {
                        command.setAction(CMD_ADD_FILTER);
                        auto* filt = handles.findHandle(command.getSource());
                        if (filt != nullptr) {
                            if ((!filt->type_in.empty()) || (!filt->type_out.empty())) {
                                command.setStringData(filt->type_in, filt->type_out);
                            }
                            if (checkActionFlag(*filt, clone_flag)) {
                                setActionFlag(command, clone_flag);
                            }
                        }
                    }
                    command.setDestination(ept->handle);
                    routeMessage(command);
                    command.setAction(CMD_ADD_ENDPOINT);
                    if (command.counter == static_cast<uint16_t>(InterfaceType::ENDPOINT)) {
                        toggleActionFlag(command, destination_target);
                        command.name(ept->key);
                        command.setString(typeStringLoc, ept->type);
                    }
                    command.swapSourceDest();
                    // command.setSource(ept->handle);

                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_ENDPOINT);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(ept->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        default:
            break;
    }

    if (!foundInterface) {
        if (isRootc) {
            switch (command.action()) {
                case CMD_ADD_NAMED_PUBLICATION:
                    unknownHandles.addUnknownPublication(command.name(),
                                                         command.getSource(),
                                                         command.flags);
                    break;
                case CMD_ADD_NAMED_INPUT:
                    unknownHandles.addUnknownInput(command.name(),
                                                   command.getSource(),
                                                   command.flags);
                    if (!command.getStringData().empty()) {
                        auto* pub = handles.findHandle(command.getSource());
                        if (pub == nullptr) {
                            // an anonymous publisher is adding an input
                            auto& apub = handles.addHandle(command.source_id,
                                                           command.source_handle,
                                                           InterfaceType::PUBLICATION,
                                                           std::string_view(),
                                                           command.getString(typeStringLoc),
                                                           command.getString(unitStringLoc));

                            addLocalInfo(apub, command);
                        }
                    }
                    break;
                case CMD_ADD_NAMED_ENDPOINT:
                    unknownHandles.addUnknownEndpoint(command.name(),
                                                      command.getSource(),
                                                      command.flags);
                    if (!command.getStringData().empty()) {
                        auto* filt = handles.findHandle(command.getSource());
                        if (filt == nullptr) {
                            // an anonymous filter is adding an endpoint
                            auto& afilt = handles.addHandle(command.source_id,
                                                            command.source_handle,
                                                            InterfaceType::FILTER,
                                                            "",
                                                            command.getString(typeStringLoc),
                                                            command.getString(typeOutStringLoc));

                            addLocalInfo(afilt, command);
                        }
                    }
                    break;
                case CMD_ADD_NAMED_FILTER:
                    unknownHandles.addUnknownFilter(command.name(),
                                                    command.getSource(),
                                                    command.flags);
                    break;
                default:
                    LOG_WARNING(global_broker_id_local,
                                getIdentifier(),
                                "unknown command in interface addition code section\n");
                    break;
            }
        } else {
            routeMessage(command);
        }
    }
}